

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setHighsIntOptionValue(void *highs,char *option,HighsInt value)

{
  HighsInt HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Highs_setHighsIntOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"Highs_setIntOptionValue",&local_5a);
  Highs::deprecationMessage((Highs *)highs,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = Highs_setIntOptionValue(highs,option,value);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsIntOptionValue(void* highs, const char* option,
                                      const HighsInt value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setHighsIntOptionValue",
                           "Highs_setIntOptionValue");
  return Highs_setIntOptionValue(highs, option, value);
}